

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

void __thiscall KeyPair::KeyPair(KeyPair *this,CKey *key,uint256 *merkle_root)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  int iVar2;
  secp256k1_keypair *keypair_00;
  secp256k1_context *ctx;
  long in_RDX;
  secp256k1_context *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  bool success;
  secp256k1_keypair *keypair;
  uint256 tweak;
  uchar pubkey_bytes [32];
  secp256k1_xonly_pubkey pubkey;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffe98;
  KeyPair *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint256 *in_stack_fffffffffffffeb0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffeb8;
  secp256k1_context *pubkey_00;
  secp256k1_context *ctx_00;
  secp256k1_keypair *seckey32;
  secp256k1_keypair *in_stack_ffffffffffffff20;
  secp256k1_context *in_stack_ffffffffffffff28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx_00 = in_RDI;
  std::
  unique_ptr<std::array<unsigned_char,96ul>,SecureUniqueDeleter<std::array<unsigned_char,96ul>>>::
  unique_ptr<SecureUniqueDeleter<std::array<unsigned_char,96ul>>,void>
            ((unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
              *)in_stack_fffffffffffffe98);
  MakeKeyPairData(in_stack_fffffffffffffea0);
  std::
  unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
  ::operator->((unique_ptr<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
                *)in_stack_fffffffffffffe98);
  keypair_00 = (secp256k1_keypair *)
               std::array<unsigned_char,_96UL>::data
                         ((array<unsigned_char,_96UL> *)in_stack_fffffffffffffe98);
  pubkey_00 = secp256k1_context_sign;
  seckey32 = keypair_00;
  ctx = (secp256k1_context *)
        CKey::data((CKey *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  UCharCast((byte *)in_stack_fffffffffffffe98);
  iVar2 = secp256k1_keypair_create
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,seckey32->data);
  bVar3 = iVar2 != 0;
  if ((bVar3) && (in_RDX != 0)) {
    iVar2 = secp256k1_keypair_xonly_pub
                      (ctx_00,(secp256k1_xonly_pubkey *)in_RDI,(int *)ctx,keypair_00);
    if (iVar2 == 0) {
      __assert_fail("secp256k1_keypair_xonly_pub(secp256k1_context_sign, &pubkey, nullptr, keypair)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x1a2,"KeyPair::KeyPair(const CKey &, const uint256 *)");
    }
    iVar2 = secp256k1_xonly_pubkey_serialize
                      (ctx,keypair_00->data,(secp256k1_xonly_pubkey *)pubkey_00);
    if (iVar2 == 0) {
      __assert_fail("secp256k1_xonly_pubkey_serialize(secp256k1_context_sign, pubkey_bytes, &pubkey)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                    ,0x1a3,"KeyPair::KeyPair(const CKey &, const uint256 *)");
    }
    std::span<const_unsigned_char,_18446744073709551615UL>::span<32UL>
              (in_stack_fffffffffffffe98,(type_identity_t<element_type> (*) [32])0x1eeaae);
    bytes._M_extent._M_extent_value = in_stack_fffffffffffffeb8._M_extent_value;
    bytes._M_ptr = (pointer)in_stack_fffffffffffffeb0;
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_fffffffffffffe98,bytes);
    base_blob<256U>::IsNull
              ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    XOnlyPubKey::ComputeTapTweakHash
              ((XOnlyPubKey *)in_stack_fffffffffffffeb8._M_extent_value,in_stack_fffffffffffffeb0);
    base_blob<256U>::data((base_blob<256U> *)in_stack_fffffffffffffe98);
    iVar2 = secp256k1_keypair_xonly_tweak_add
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,seckey32->data);
    bVar3 = iVar2 != 0;
  }
  if (!bVar3) {
    ClearKeyPairData((KeyPair *)in_stack_fffffffffffffe98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

KeyPair::KeyPair(const CKey& key, const uint256* merkle_root)
{
    static_assert(std::tuple_size<KeyType>() == sizeof(secp256k1_keypair));
    MakeKeyPairData();
    auto keypair = reinterpret_cast<secp256k1_keypair*>(m_keypair->data());
    bool success = secp256k1_keypair_create(secp256k1_context_sign, keypair, UCharCast(key.data()));
    if (success && merkle_root) {
        secp256k1_xonly_pubkey pubkey;
        unsigned char pubkey_bytes[32];
        assert(secp256k1_keypair_xonly_pub(secp256k1_context_sign, &pubkey, nullptr, keypair));
        assert(secp256k1_xonly_pubkey_serialize(secp256k1_context_sign, pubkey_bytes, &pubkey));
        uint256 tweak = XOnlyPubKey(pubkey_bytes).ComputeTapTweakHash(merkle_root->IsNull() ? nullptr : merkle_root);
        success = secp256k1_keypair_xonly_tweak_add(secp256k1_context_static, keypair, tweak.data());
    }
    if (!success) ClearKeyPairData();
}